

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O2

void duckdb::TemplatedGetSortKeyLength<duckdb::SortKeyBlobOperator>
               (SortKeyVectorData *vector_data,SortKeyChunk chunk,SortKeyLengthInfo *result)

{
  pointer puVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  bool bVar4;
  idx_t iVar5;
  undefined8 extraout_RDX;
  ulong uVar6;
  ulong row_idx;
  idx_t iVar7;
  TYPE input;
  
  pdVar2 = (vector_data->format).data;
  for (iVar7 = chunk.start; iVar7 < chunk.end; iVar7 = iVar7 + 1) {
    psVar3 = ((vector_data->format).sel)->sel_vector;
    row_idx = iVar7;
    if (psVar3 != (sel_t *)0x0) {
      row_idx = (ulong)psVar3[iVar7];
    }
    uVar6 = iVar7;
    if (((undefined1  [32])chunk & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
      uVar6 = chunk.result_index;
    }
    puVar1 = (result->variable_lengths).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start + uVar6;
    *puVar1 = *puVar1 + 1;
    bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&(vector_data->format).validity.super_TemplatedValidityMask<unsigned_long>,
                       row_idx);
    if (bVar4) {
      input.value.pointer.ptr = (char *)extraout_RDX;
      input.value._0_8_ = *(undefined8 *)(pdVar2 + row_idx * 0x10 + 8);
      iVar5 = SortKeyBlobOperator::GetEncodeLength
                        (*(SortKeyBlobOperator **)(pdVar2 + row_idx * 0x10),input);
      puVar1 = (result->variable_lengths).
               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + uVar6;
      *puVar1 = *puVar1 + iVar5;
    }
  }
  return;
}

Assistant:

void TemplatedGetSortKeyLength(SortKeyVectorData &vector_data, SortKeyChunk chunk, SortKeyLengthInfo &result) {
	auto &format = vector_data.format;
	auto data = UnifiedVectorFormat::GetData<typename OP::TYPE>(vector_data.format);
	for (idx_t r = chunk.start; r < chunk.end; r++) {
		auto idx = format.sel->get_index(r);
		auto result_index = chunk.GetResultIndex(r);
		result.variable_lengths[result_index]++; // every value is prefixed by a validity byte

		if (!format.validity.RowIsValid(idx)) {
			continue;
		}
		result.variable_lengths[result_index] += OP::GetEncodeLength(data[idx]);
	}
}